

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O3

void __thiscall AliTcpConnection::Close(AliTcpConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (this->fd_ != 0) {
    close(this->fd_);
  }
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_00198af8;
  pcVar2 = (this->host_)._M_dataplus._M_p;
  paVar1 = &(this->host_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

void AliTcpConnection::Close() {
  if(fd_) {
#ifdef WIN32
    closesocket(fd_);
#else
    ::close(fd_);
#endif
  }

  delete this;
  return;
}